

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O3

void __thiscall
cppgenerate::MemberVariable::MemberVariable(MemberVariable *this,MemberVariable *other)

{
  Variable::Variable(&this->super_Variable,&other->super_Variable);
  (this->super_Variable)._vptr_Variable = (_func_int **)&PTR__MemberVariable_00119d80;
  (this->m_changedSignalName)._M_dataplus._M_p = (pointer)&(this->m_changedSignalName).field_2;
  (this->m_changedSignalName)._M_string_length = 0;
  (this->m_changedSignalName).field_2._M_local_buf[0] = '\0';
  this->m_access = other->m_access;
  this->m_generateGetter = other->m_generateGetter;
  this->m_generateSetter = other->m_generateSetter;
  this->m_isQProperty = other->m_isQProperty;
  return;
}

Assistant:

MemberVariable::MemberVariable( const MemberVariable& other ) :
    Variable( other ) {
    m_access = other.m_access;
    m_generateGetter = other.m_generateGetter;
    m_generateSetter = other.m_generateSetter;
    m_isQProperty = other.m_isQProperty;
}